

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlDocument::Print(TiXmlDocument *this,FILE *cfile,int depth)

{
  TiXmlNode *local_28;
  TiXmlNode *node;
  int depth_local;
  FILE *cfile_local;
  TiXmlDocument *this_local;
  
  if (cfile != (FILE *)0x0) {
    for (local_28 = TiXmlNode::FirstChild(&this->super_TiXmlNode); local_28 != (TiXmlNode *)0x0;
        local_28 = TiXmlNode::NextSibling(local_28)) {
      (*(local_28->super_TiXmlBase)._vptr_TiXmlBase[2])(local_28,cfile,(ulong)(uint)depth);
      fprintf((FILE *)cfile,"\n");
    }
    return;
  }
  __assert_fail("cfile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                ,0x47b,"virtual void TiXmlDocument::Print(FILE *, int) const");
}

Assistant:

void TiXmlDocument::Print( FILE* cfile, int depth ) const
{
	assert( cfile );
	for ( const TiXmlNode* node=FirstChild(); node; node=node->NextSibling() )
	{
		node->Print( cfile, depth );
		fprintf( cfile, "\n" );
	}
}